

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.hpp
# Opt level: O0

idx_t duckdb::UncompressedStringStorage::StringAppendBase
                (BufferHandle *handle,ColumnSegment *segment,SegmentStatistics *stats,
                UnifiedVectorFormat *data,idx_t offset,idx_t count)

{
  long lVar1;
  string_t string;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  string_t *psVar6;
  uint *puVar7;
  long *plVar8;
  idx_t iVar9;
  long lVar10;
  BlockManager *pBVar11;
  data_ptr_t pdVar12;
  BlockManager *__n;
  BlockManager *pBVar13;
  char *__src;
  UnifiedVectorFormat *in_RCX;
  long in_RSI;
  long in_R8;
  ulong in_R9;
  data_ptr_t dict_pos_1;
  data_ptr_t dict_pos;
  int32_t current_offset;
  block_id_t block;
  idx_t required_space;
  bool use_overflow_block;
  idx_t string_length;
  data_ptr_t end;
  unsigned_long target_idx;
  idx_t source_idx;
  idx_t i;
  __int_type base_count;
  idx_t remaining_space;
  uint32_t *dictionary_end;
  uint32_t *dictionary_size;
  int32_t *result_data;
  string_t *source_data;
  data_ptr_t handle_ptr;
  memory_order __b;
  string_t *in_stack_fffffffffffffee8;
  BlockManager *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 uVar14;
  ColumnSegment *in_stack_ffffffffffffff00;
  string_t *in_stack_ffffffffffffff10;
  block_id_t *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff30;
  int32_t in_stack_ffffffffffffff34;
  block_id_t local_c8;
  BlockManager *local_c0;
  __int_type local_90;
  BlockManager *local_80;
  
  puVar5 = (uint *)BufferHandle::Ptr((BufferHandle *)0xa32c94);
  psVar6 = UnifiedVectorFormat::GetData<duckdb::string_t>(in_RCX);
  puVar7 = puVar5 + 2;
  local_80 = (BlockManager *)
             RemainingSpace(in_stack_ffffffffffffff00,
                            (BufferHandle *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  plVar8 = (long *)(in_RSI + 8);
  ::std::operator&(memory_order_seq_cst,__memory_order_mask);
  uVar14 = 5;
  lVar1 = *plVar8;
  local_90 = 0;
  while( true ) {
    if (in_R9 <= local_90) {
      ::std::__atomic_base<unsigned_long>::operator+=
                ((__atomic_base<unsigned_long> *)(in_RSI + 8),in_R9);
      return in_R9;
    }
    iVar9 = SelectionVector::get_index(in_RCX->sel,in_R8 + local_90);
    lVar10 = lVar1 + local_90;
    if (local_80 < (BlockManager *)0x4) break;
    pBVar11 = (BlockManager *)((long)&local_80[-1].block_header_size.index + 4);
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)
                       CONCAT44(uVar14,in_stack_fffffffffffffef8),(idx_t)in_stack_fffffffffffffef0);
    if (bVar2) {
      pdVar12 = BufferHandle::Ptr((BufferHandle *)0xa32ede);
      uVar4 = puVar5[1];
      __n = (BlockManager *)string_t::GetSize(psVar6 + iVar9);
      in_stack_fffffffffffffef0 = __n;
      ColumnSegment::GetBlockManager((ColumnSegment *)0xa32f37);
      BlockManager::GetBlockSize(in_stack_fffffffffffffef0);
      pBVar13 = (BlockManager *)StringUncompressed::GetStringBlockLimit(0xa32f47);
      bVar2 = pBVar13 <= in_stack_fffffffffffffef0;
      local_c0 = __n;
      if (bVar2) {
        local_c0 = (BlockManager *)0xc;
      }
      if (pBVar11 < local_c0) {
        ::std::__atomic_base<unsigned_long>::operator+=
                  ((__atomic_base<unsigned_long> *)(in_RSI + 8),local_90);
        return local_90;
      }
      UpdateStringStats((SegmentStatistics *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar2) {
        string.value._8_4_ = in_stack_ffffffffffffff30;
        string.value._0_8_ = psVar6[iVar9].value.pointer.ptr;
        string.value._12_4_ = in_stack_ffffffffffffff34;
        WriteString(*(ColumnSegment **)&psVar6[iVar9].value,string,in_stack_ffffffffffffff18,
                    (int32_t *)in_stack_ffffffffffffff10);
        *puVar5 = *puVar5 + 0xc;
        in_stack_ffffffffffffff18 = (block_id_t *)(pdVar12 + ((ulong)uVar4 - (ulong)*puVar5));
        WriteStringMarker((data_ptr_t)in_stack_ffffffffffffff18,local_c8,in_stack_ffffffffffffff34);
        iVar3 = NumericCast<int,unsigned_int,void>(0);
        puVar7[lVar10] = -iVar3;
        local_80 = (BlockManager *)&local_80[-1].block_alloc_size;
      }
      else {
        *puVar5 = *puVar5 + (int)local_c0;
        in_stack_fffffffffffffee8 = (string_t *)(pdVar12 + ((ulong)uVar4 - (ulong)*puVar5));
        in_stack_ffffffffffffff10 = in_stack_fffffffffffffee8;
        __src = string_t::GetData((string_t *)in_stack_fffffffffffffef0);
        memcpy(in_stack_fffffffffffffee8,__src,(size_t)__n);
        uVar4 = NumericCast<int,unsigned_int,void>(0);
        puVar7[lVar10] = uVar4;
        local_80 = (BlockManager *)((long)pBVar11 - (long)local_c0);
      }
    }
    else {
      local_80 = pBVar11;
      if (lVar10 == 0) {
        *puVar7 = 0;
      }
      else {
        puVar7[lVar10] = puVar7[lVar10 + -1];
      }
    }
    local_90 = local_90 + 1;
  }
  ::std::__atomic_base<unsigned_long>::operator+=
            ((__atomic_base<unsigned_long> *)(in_RSI + 8),local_90);
  return local_90;
}

Assistant:

static idx_t StringAppendBase(BufferHandle &handle, ColumnSegment &segment, SegmentStatistics &stats,
	                              UnifiedVectorFormat &data, idx_t offset, idx_t count) {
		D_ASSERT(segment.GetBlockOffset() == 0);
		auto handle_ptr = handle.Ptr();
		auto source_data = UnifiedVectorFormat::GetData<string_t>(data);
		auto result_data = reinterpret_cast<int32_t *>(handle_ptr + DICTIONARY_HEADER_SIZE);
		auto dictionary_size = reinterpret_cast<uint32_t *>(handle_ptr);
		auto dictionary_end = reinterpret_cast<uint32_t *>(handle_ptr + sizeof(uint32_t));

		idx_t remaining_space = RemainingSpace(segment, handle);
		auto base_count = segment.count.load();
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = data.sel->get_index(offset + i);
			auto target_idx = base_count + i;
			if (remaining_space < sizeof(int32_t)) {
				// string index does not fit in the block at all
				segment.count += i;
				return i;
			}
			remaining_space -= sizeof(int32_t);
			if (!data.validity.RowIsValid(source_idx)) {
				// null value is stored as a copy of the last value, this is done to be able to efficiently do the
				// string_length calculation
				if (target_idx > 0) {
					result_data[target_idx] = result_data[target_idx - 1];
				} else {
					result_data[target_idx] = 0;
				}
				continue;
			}
			auto end = handle.Ptr() + *dictionary_end;

#ifdef DEBUG
			GetDictionary(segment, handle).Verify(segment.GetBlockManager().GetBlockSize());
#endif
			// Unknown string, continue
			// non-null value, check if we can fit it within the block
			idx_t string_length = source_data[source_idx].GetSize();

			// determine whether or not we have space in the block for this string
			bool use_overflow_block = false;
			idx_t required_space = string_length;
			if (DUCKDB_UNLIKELY(required_space >=
			                    StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize()))) {
				// string exceeds block limit, store in overflow block and only write a marker here
				required_space = BIG_STRING_MARKER_SIZE;
				use_overflow_block = true;
			}
			if (DUCKDB_UNLIKELY(required_space > remaining_space)) {
				// no space remaining: return how many tuples we ended up writing
				segment.count += i;
				return i;
			}

			// we have space: write the string
			UpdateStringStats(stats, source_data[source_idx]);

			if (DUCKDB_UNLIKELY(use_overflow_block)) {
				// write to overflow blocks
				block_id_t block;
				int32_t current_offset;
				// write the string into the current string block
				WriteString(segment, source_data[source_idx], block, current_offset);
				*dictionary_size += BIG_STRING_MARKER_SIZE;
				remaining_space -= BIG_STRING_MARKER_SIZE;
				auto dict_pos = end - *dictionary_size;

				// write a big string marker into the dictionary
				WriteStringMarker(dict_pos, block, current_offset);

				// place the dictionary offset into the set of vectors
				// note: for overflow strings we write negative value

				// dictionary_size is an uint32_t value, so we can cast up.
				D_ASSERT(NumericCast<idx_t>(*dictionary_size) <= segment.GetBlockManager().GetBlockSize());
				result_data[target_idx] = -NumericCast<int32_t>((*dictionary_size));
			} else {
				// string fits in block, append to dictionary and increment dictionary position
				D_ASSERT(string_length < NumericLimits<uint16_t>::Maximum());
				*dictionary_size += required_space;
				remaining_space -= required_space;
				auto dict_pos = end - *dictionary_size;
				// now write the actual string data into the dictionary
				memcpy(dict_pos, source_data[source_idx].GetData(), string_length);

				// dictionary_size is an uint32_t value, so we can cast up.
				D_ASSERT(NumericCast<idx_t>(*dictionary_size) <= segment.GetBlockManager().GetBlockSize());
				// Place the dictionary offset into the set of vectors.
				result_data[target_idx] = NumericCast<int32_t>(*dictionary_size);
			}
			D_ASSERT(RemainingSpace(segment, handle) <= segment.GetBlockManager().GetBlockSize());
#ifdef DEBUG
			GetDictionary(segment, handle).Verify(segment.GetBlockManager().GetBlockSize());
#endif
		}
		segment.count += count;
		return count;
	}